

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  int iVar21;
  stbi_uc asVar22 [4];
  uint uVar23;
  int iVar24;
  uint uVar25;
  void *pvVar26;
  stbi__context *psVar27;
  stbi__uint16 *psVar28;
  stbi__jpeg *psVar29;
  stbi_uc *psVar30;
  long lVar31;
  uchar *puVar32;
  code *pcVar33;
  undefined8 uVar34;
  char *pcVar35;
  long lVar36;
  short sVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  stbi__jpeg *psVar41;
  int id;
  ulong uVar42;
  stbi__context *psVar43;
  int iVar44;
  undefined1 *puVar45;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar46;
  byte *pbVar47;
  stbi__result_info *ri_00;
  int iVar48;
  uint uVar49;
  uint uVar50;
  stbi_uc *pal_entry;
  uint uVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  stbi_uc *psVar55;
  short *psVar56;
  stbi_uc *psVar57;
  long *in_FS_OFFSET;
  bool bVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  stbi__uint16 *local_8988;
  stbi__uint16 *local_8980;
  uint local_8970;
  uint local_8950;
  stbi__jpeg *local_8948;
  uint local_890c;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  uint uStack_88dc;
  int local_88d8;
  uint local_88c8;
  uint local_88bc;
  stbi_uc pal [256] [4];
  
  psVar57 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      pal._0_8_ = s;
      iVar16 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
      uVar34 = pal._0_8_;
      if (iVar16 == 0) {
        psVar27 = (stbi__context *)0x0;
      }
      else {
        if ((int)pal[8] < 9) {
          iVar16 = 8;
        }
        else {
          if (pal[8] != (stbi_uc  [4])0x10) {
            lVar36 = *in_FS_OFFSET;
            pcVar35 = "bad bits_per_channel";
            goto LAB_0014098d;
          }
          iVar16 = 0x10;
        }
        ri->bits_per_channel = iVar16;
        if ((req_comp != 0) && (iVar16 = *(int *)(pal._0_8_ + 0xc), iVar16 != req_comp)) {
          if ((int)pal[8] < 9) {
            pal._24_8_ = stbi__convert_format
                                   ((uchar *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          else {
            pal._24_8_ = stbi__convert_format16
                                   ((stbi__uint16 *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          *(int *)(uVar34 + 0xc) = req_comp;
          if ((stbi__context *)pal._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar34;
        *y = *(int *)(uVar34 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar34 + 8);
        }
        psVar27 = (stbi__context *)pal._24_8_;
        pal._24_8_ = (void *)0x0;
      }
      free((void *)pal._24_8_);
      free((void *)pal._16_8_);
      psVar29 = (stbi__jpeg *)pal._8_8_;
      goto LAB_00140d94;
    }
    lVar36 = *in_FS_OFFSET;
    pcVar35 = "bad req_comp";
    goto LAB_0014098d;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar17 = stbi__get32le(s);
    if (((0x38 < sVar17) || ((0x100010000001000U >> ((ulong)sVar17 & 0x3f) & 1) == 0)) &&
       ((sVar17 != 0x7c && (sVar17 != 0x6c)))) goto LAB_00140b0e;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar26 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar26 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar18 = s->img_y;
    uVar23 = -uVar18;
    if (0 < (int)uVar18) {
      uVar23 = uVar18;
    }
    s->img_y = uVar23;
    if ((0x1000000 < uVar23) || (0x1000000 < s->img_x)) goto LAB_00143318;
    uStack_88dc = 0xff;
    if (iStack_88f0 == 0xc) {
      if (0x17 < (int)value) goto LAB_001416f7;
      uVar23 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_00141611:
      if (uVar23 == 0) goto LAB_001416f7;
      bVar58 = false;
LAB_00141639:
      bVar8 = uStack_88e0 == 0xff000000;
      iVar16 = 4 - (uint)(uStack_88e0 == 0);
      asVar22 = value;
    }
    else {
      if ((int)value < 0x10) {
        uVar23 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
        goto LAB_00141611;
      }
LAB_001416f7:
      iVar16 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read
      ;
      if (iVar16 - 0x401U < 0xfffffc00) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "bad header";
        goto LAB_0014098d;
      }
      if ((iStack_88f4 < iVar16) || (0x400 < iStack_88f4 - iVar16)) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "bad offset";
        goto LAB_0014098d;
      }
      stbi__skip(s,iStack_88f4 - iVar16);
      uVar23 = 0;
      bVar58 = true;
      if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_00141639;
      bVar8 = true;
      iVar16 = 3;
      asVar22[0] = '\x18';
      asVar22[1] = '\0';
      asVar22[2] = '\0';
      asVar22[3] = '\0';
      bVar58 = true;
    }
    s->img_n = iVar16;
    if (2 < req_comp) {
      iVar16 = req_comp;
    }
    sVar17 = s->img_x;
    sVar19 = s->img_y;
    iVar21 = stbi__mad3sizes_valid(iVar16,sVar17,sVar19,0);
    if (iVar21 == 0) goto LAB_00143318;
    local_8980 = (stbi__uint16 *)stbi__malloc_mad3(iVar16,sVar17,sVar19,0);
    if (local_8980 != (stbi__uint16 *)0x0) {
      if ((int)asVar22 < 0x10) {
        if (!bVar58 && (int)uVar23 < 0x101) {
          uVar40 = 0;
          uVar53 = 0;
          if (0 < (int)uVar23) {
            uVar53 = (ulong)uVar23;
          }
          for (; uVar53 != uVar40; uVar40 = uVar40 + 1) {
            sVar9 = stbi__get8(s);
            pal[uVar40][2] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar40][1] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar40][0] = sVar9;
            if (iStack_88f0 != 0xc) {
              stbi__get8(s);
            }
            pal[uVar40][3] = 0xff;
          }
          stbi__skip(s,(uVar23 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                       (iStack_88f0 + local_88d8));
          if (asVar22 == (stbi_uc  [4])0x1) {
            sVar19 = s->img_x;
            iVar21 = 0;
            uVar23 = 0;
LAB_00142e69:
            uVar40 = (ulong)uVar23;
            sVar17 = s->img_y;
            if (iVar21 < (int)sVar17) {
              iVar39 = 0;
              do {
                bVar15 = stbi__get8(s);
                sVar17 = s->img_x;
                iVar44 = 8;
                do {
                  uVar23 = (uint)uVar40;
                  if ((int)sVar17 <= iVar39) {
LAB_00142f06:
                    stbi__skip(s,-(sVar19 + 7 >> 3) & 3);
                    iVar21 = iVar21 + 1;
                    goto LAB_00142e69;
                  }
                  bVar58 = (bVar15 >> (iVar44 - 1U & 0x1f) & 1) != 0;
                  lVar36 = (long)(int)uVar23;
                  uVar40 = lVar36 + 3;
                  *(stbi_uc *)((long)local_8980 + lVar36) = pal[bVar58][0];
                  *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[bVar58][1];
                  *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[bVar58][2];
                  if (iVar16 == 4) {
                    *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                    uVar40 = (ulong)(uVar23 + 4);
                  }
                  if (sVar17 - 1 == iVar39) {
                    uVar23 = (uint)uVar40;
                    goto LAB_00142f06;
                  }
                  iVar39 = iVar39 + 1;
                  iVar48 = iVar44 + -1;
                  bVar58 = 0 < iVar44;
                  iVar44 = iVar48;
                } while (iVar48 != 0 && bVar58);
              } while( true );
            }
            local_8950 = 0xff;
            uStack_88dc = local_8950;
          }
          else {
            if (asVar22 == (stbi_uc  [4])0x8) {
              uVar23 = s->img_x;
            }
            else {
              if (asVar22 != (stbi_uc  [4])0x4) {
                free(local_8980);
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad bpp";
                goto LAB_0014098d;
              }
              uVar23 = s->img_x + 1 >> 1;
            }
            local_8988._0_4_ = -uVar23 & 3;
            uVar40 = 0;
            for (iVar21 = 0; sVar17 = s->img_y, iVar21 < (int)sVar17; iVar21 = iVar21 + 1) {
              for (iVar39 = 0; iVar39 < (int)s->img_x; iVar39 = iVar39 + 2) {
                bVar15 = stbi__get8(s);
                uVar25 = bVar15 & 0xf;
                uVar23 = (uint)(bVar15 >> 4);
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar23 = (uint)bVar15;
                }
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar25 = 0;
                }
                lVar36 = (long)(int)uVar40;
                uVar53 = lVar36 + 3;
                *(stbi_uc *)((long)local_8980 + lVar36) = pal[uVar23][0];
                *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[uVar23][1];
                *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[uVar23][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                  uVar53 = (ulong)((int)uVar40 + 4);
                }
                if (iVar39 + 1U == s->img_x) {
                  uVar40 = uVar53 & 0xffffffff;
                  break;
                }
                if (asVar22 == (stbi_uc  [4])0x8) {
                  bVar15 = stbi__get8(s);
                  uVar25 = (uint)bVar15;
                }
                lVar36 = (long)(int)uVar53;
                uVar40 = lVar36 + 3;
                *(stbi_uc *)((long)local_8980 + lVar36) = pal[uVar25][0];
                *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[uVar25][1];
                *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[uVar25][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                  uVar40 = (ulong)((int)uVar53 + 4);
                }
              }
              stbi__skip(s,(uint)local_8988);
            }
          }
          goto LAB_00142b68;
        }
        free(local_8980);
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "invalid";
        goto LAB_0014098d;
      }
      stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
      if (asVar22 != (stbi_uc  [4])0x10) {
        if (asVar22 == (stbi_uc  [4])0x20) {
          local_88fc = 0;
          if ((bool)(bVar8 & (uStack_88ec == 0xff0000 &&
                             (local_88e8 == 0xff00 && uStack_88e4 == 0xff)))) {
            bVar58 = true;
            goto LAB_001426ef;
          }
          goto LAB_00142749;
        }
        local_88fc = 0;
        if (asVar22 != (stbi_uc  [4])0x18) goto LAB_00142749;
        local_88fc = s->img_x & 3;
        bVar58 = false;
LAB_001426ef:
        bVar8 = false;
        iVar48 = 0;
        iVar21 = 0;
        iVar39 = 0;
        iVar44 = 0;
        uVar23 = 0;
        local_890c = 0;
        local_88bc = 0;
        local_88c8 = 0;
LAB_00142989:
        local_8988._0_4_ = 0;
        for (iVar38 = 0; sVar17 = s->img_y, iVar38 < (int)sVar17; iVar38 = iVar38 + 1) {
          if (bVar8) {
            for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 1) {
              if (asVar22 == (stbi_uc  [4])0x10) {
                uVar25 = stbi__get16le(s);
              }
              else {
                uVar25 = stbi__get32le(s);
              }
              iVar24 = stbi__shiftsigned(uVar25 & uStack_88ec,iVar48,uVar23);
              lVar36 = (long)(int)(uint)local_8988;
              *(uchar *)((long)local_8980 + lVar36) = (uchar)iVar24;
              iVar24 = stbi__shiftsigned(uVar25 & local_88e8,iVar21,local_890c);
              *(uchar *)((long)local_8980 + lVar36 + 1) = (uchar)iVar24;
              iVar24 = stbi__shiftsigned(uVar25 & uStack_88e4,iVar39,local_88bc);
              *(uchar *)((long)local_8980 + lVar36 + 2) = (uchar)iVar24;
              if (uStack_88e0 == 0) {
                uVar25 = 0xff;
              }
              else {
                uVar25 = stbi__shiftsigned(uVar25 & uStack_88e0,iVar44,local_88c8);
              }
              iVar24 = (uint)local_8988 + 3;
              if (iVar16 == 4) {
                *(uchar *)((long)local_8980 + lVar36 + 3) = (uchar)uVar25;
                iVar24 = (uint)local_8988 + 4;
              }
              local_8988._0_4_ = iVar24;
              uStack_88dc = uStack_88dc | uVar25;
            }
          }
          else {
            for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 1) {
              sVar9 = stbi__get8(s);
              lVar36 = (long)(int)(uint)local_8988;
              *(stbi_uc *)((long)local_8980 + lVar36 + 2) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)local_8980 + lVar36 + 1) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)local_8980 + lVar36) = sVar9;
              bVar15 = 0xff;
              if (bVar58) {
                bVar15 = stbi__get8(s);
              }
              iVar24 = (uint)local_8988 + 3;
              if (iVar16 == 4) {
                *(byte *)((long)local_8980 + lVar36 + 3) = bVar15;
                iVar24 = (uint)local_8988 + 4;
              }
              local_8988._0_4_ = iVar24;
              uStack_88dc = uStack_88dc | bVar15;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_00142b68:
        if ((iVar16 == 4) && (uStack_88dc == 0)) {
          for (uVar23 = s->img_x * sVar17 * 4 - 1; -1 < (int)uVar23; uVar23 = uVar23 - 4) {
            *(uchar *)((long)local_8980 + (ulong)uVar23) = 0xff;
          }
        }
        if (0 < (int)uVar18) {
          iVar21 = (int)sVar17 >> 1;
          if ((int)sVar17 >> 1 < 1) {
            iVar21 = 0;
          }
          iVar39 = (sVar17 - 1) * iVar16;
          iVar48 = 0;
          for (iVar44 = 0; iVar44 != iVar21; iVar44 = iVar44 + 1) {
            sVar19 = s->img_x;
            uVar40 = (ulong)(sVar19 * iVar16);
            if ((int)(sVar19 * iVar16) < 1) {
              uVar40 = 0;
            }
            for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
              uVar2 = *(uchar *)((long)local_8980 + uVar53 + sVar19 * iVar48);
              *(uchar *)((long)local_8980 + uVar53 + sVar19 * iVar48) =
                   *(uchar *)((long)local_8980 + uVar53 + sVar19 * iVar39);
              *(uchar *)((long)local_8980 + uVar53 + sVar19 * iVar39) = uVar2;
            }
            iVar39 = iVar39 - iVar16;
            iVar48 = iVar48 + iVar16;
          }
        }
        uVar18 = s->img_x;
        if ((req_comp != 0) && (iVar16 != req_comp)) {
          local_8980 = (stbi__uint16 *)
                       stbi__convert_format((uchar *)local_8980,iVar16,req_comp,uVar18,sVar17);
          if (local_8980 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
          uVar18 = s->img_x;
        }
        *x = uVar18;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return (uchar *)local_8980;
        }
        return (uchar *)local_8980;
      }
      local_88fc = s->img_x * 2 & 2;
LAB_00142749:
      if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
        iVar48 = stbi__high_bit(uStack_88ec);
        uVar23 = stbi__bitcount(uStack_88ec);
        iVar21 = stbi__high_bit(local_88e8);
        local_890c = stbi__bitcount(local_88e8);
        iVar39 = stbi__high_bit(uStack_88e4);
        local_88bc = stbi__bitcount(uStack_88e4);
        iVar44 = stbi__high_bit(uStack_88e0);
        local_88c8 = stbi__bitcount(uStack_88e0);
        if ((local_88bc < 9 && (local_890c < 9 && uVar23 < 9)) && local_88c8 < 9) {
          iVar48 = iVar48 + -7;
          iVar21 = iVar21 + -7;
          iVar39 = iVar39 + -7;
          iVar44 = iVar44 + -7;
          bVar8 = true;
          bVar58 = false;
          goto LAB_00142989;
        }
      }
      free(local_8980);
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "bad masks";
      goto LAB_0014098d;
    }
LAB_001423b8:
    lVar36 = *in_FS_OFFSET;
    pcVar35 = "outofmem";
    goto LAB_0014098d;
  }
LAB_00140b0e:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar16 = stbi__gif_test(s);
  if (iVar16 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    psVar27 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar57);
    if (psVar27 == (stbi__context *)0x0 || psVar27 == s) {
      free((void *)pal._8_8_);
      psVar27 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar27 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar27,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    psVar29 = (stbi__jpeg *)pal._16_8_;
    goto LAB_00140d94;
  }
  sVar17 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar17 == 0x38425053) {
    sVar17 = stbi__get32be(s);
    if (sVar17 != 0x38425053) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "not PSD";
      goto LAB_0014098d;
    }
    iVar16 = stbi__get16be(s);
    if (iVar16 != 1) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "wrong version";
      goto LAB_0014098d;
    }
    stbi__skip(s,6);
    uVar18 = stbi__get16be(s);
    if (0x10 < uVar18) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "wrong channel count";
      goto LAB_0014098d;
    }
    sVar17 = stbi__get32be(s);
    sVar19 = stbi__get32be(s);
    if (((int)sVar17 < 0x1000001) && ((int)sVar19 < 0x1000001)) {
      iVar16 = stbi__get16be(s);
      if ((iVar16 != 8) && (iVar16 != 0x10)) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "unsupported bit depth";
        goto LAB_0014098d;
      }
      iVar21 = stbi__get16be(s);
      if (iVar21 != 3) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "wrong color format";
        goto LAB_0014098d;
      }
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      uVar23 = stbi__get16be(s);
      if (1 < uVar23) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "bad compression";
        goto LAB_0014098d;
      }
      iVar21 = stbi__mad3sizes_valid(4,sVar19,sVar17,0);
      if (iVar21 != 0) {
        if (((bpc == 0x10) && (iVar16 == 0x10)) && (uVar23 == 0)) {
          local_8980 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar19,sVar17,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8980 = (stbi__uint16 *)malloc((long)(int)(sVar17 * sVar19 * 4));
        }
        if (local_8980 != (stbi__uint16 *)0x0) {
          uVar25 = sVar19 * sVar17;
          if (uVar23 == 0) {
            uVar40 = 0;
            psVar28 = local_8980;
            local_8988 = local_8980;
            uVar23 = 0;
            if (0 < (int)uVar25) {
              uVar23 = uVar25;
            }
            for (; uVar40 != 4; uVar40 = uVar40 + 1) {
              if (uVar40 < uVar18) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                    iVar21 = stbi__get16be(s);
                    local_8988[lVar36 * 4] = (stbi__uint16)iVar21;
                  }
                }
                else {
                  lVar36 = 0;
                  if (iVar16 == 0x10) {
                    for (; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      iVar21 = stbi__get16be(s);
                      *(char *)(psVar28 + lVar36 * 2) = (char)((uint)iVar21 >> 8);
                    }
                  }
                  else {
                    for (; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      sVar9 = stbi__get8(s);
                      *(stbi_uc *)(psVar28 + lVar36 * 2) = sVar9;
                    }
                  }
                }
              }
              else if (iVar16 == 0x10 && bpc == 0x10) {
                for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  local_8988[lVar36 * 4] = -(ushort)(uVar40 == 3);
                }
              }
              else {
                for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  *(char *)(psVar28 + lVar36 * 2) = -(uVar40 == 3);
                }
              }
              psVar28 = (stbi__uint16 *)((long)psVar28 + 1);
              local_8988 = local_8988 + 1;
            }
          }
          else {
            stbi__skip(s,sVar17 * uVar18 * 2);
            uVar40 = 0;
            psVar28 = local_8980;
            uVar23 = 0;
            if (0 < (int)uVar25) {
              uVar23 = uVar25;
            }
            for (; uVar40 != 4; uVar40 = uVar40 + 1) {
              if (uVar40 < uVar18) {
                psVar57 = (stbi_uc *)((long)local_8980 + uVar40);
                iVar16 = 0;
                do {
                  uVar49 = uVar25 - iVar16;
                  do {
                    if ((int)uVar49 < 1) goto LAB_001430a2;
                    bVar15 = stbi__get8(s);
                  } while (bVar15 == 0x80);
                  uVar50 = (uint)bVar15;
                  if ((char)bVar15 < '\0') {
                    uVar51 = 0x101 - uVar50;
                    if (uVar49 < uVar51) goto LAB_00143728;
                    sVar9 = stbi__get8(s);
                    for (iVar21 = uVar50 - 0x101; iVar21 != 0; iVar21 = iVar21 + 1) {
                      *psVar57 = sVar9;
                      psVar57 = psVar57 + 4;
                    }
                  }
                  else {
                    if (uVar49 <= bVar15) {
LAB_00143728:
                      free(local_8980);
                      lVar36 = *in_FS_OFFSET;
                      pcVar35 = "corrupt";
                      goto LAB_0014098d;
                    }
                    uVar51 = uVar50 + 1;
                    uVar49 = uVar51;
                    while (bVar58 = uVar49 != 0, uVar49 = uVar49 - 1, bVar58) {
                      sVar9 = stbi__get8(s);
                      *psVar57 = sVar9;
                      psVar57 = psVar57 + 4;
                    }
                  }
                  iVar16 = iVar16 + uVar51;
                } while( true );
              }
              for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                *(char *)(psVar28 + lVar36 * 2) = -(uVar40 == 3);
              }
LAB_001430a2:
              psVar28 = (stbi__uint16 *)((long)psVar28 + 1);
            }
          }
          if (3 < uVar18) {
            uVar40 = 0;
            if (0 < (int)uVar25) {
              uVar40 = (ulong)uVar25;
            }
            if (ri->bits_per_channel == 0x10) {
              for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
                uVar5 = local_8980[uVar53 * 4 + 3];
                if ((uVar5 != 0) && (uVar5 != 0xffff)) {
                  fVar60 = 1.0 / ((float)uVar5 / 65535.0);
                  fVar59 = (1.0 - fVar60) * 65535.0;
                  auVar61._0_4_ =
                       (int)(fVar59 + fVar60 * (float)(*(uint *)(local_8980 + uVar53 * 4) & 0xffff))
                  ;
                  auVar61._4_4_ =
                       (int)(fVar59 + fVar60 * (float)(*(uint *)(local_8980 + uVar53 * 4) >> 0x10));
                  auVar61._8_4_ = (int)(fVar59 + fVar60 * 0.0);
                  auVar61._12_4_ = (int)(fVar59 + fVar60 * 0.0);
                  auVar61 = pshuflw(auVar61,auVar61,0xe8);
                  *(int *)(local_8980 + uVar53 * 4) = auVar61._0_4_;
                  local_8980[uVar53 * 4 + 2] =
                       (stbi__uint16)(int)((float)local_8980[uVar53 * 4 + 2] * fVar60 + fVar59);
                }
              }
            }
            else {
              for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
                bVar15 = *(byte *)((long)local_8980 + uVar53 * 4 + 3);
                if ((bVar15 != 0) && (bVar15 != 0xff)) {
                  fVar60 = 1.0 / ((float)bVar15 / 255.0);
                  fVar59 = (1.0 - fVar60) * 255.0;
                  *(char *)(local_8980 + uVar53 * 2) =
                       (char)(int)((float)(byte)local_8980[uVar53 * 2] * fVar60 + fVar59);
                  *(char *)((long)local_8980 + uVar53 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)local_8980 + uVar53 * 4 + 1) * fVar60 +
                                  fVar59);
                  *(char *)(local_8980 + uVar53 * 2 + 1) =
                       (char)(int)((float)(byte)local_8980[uVar53 * 2 + 1] * fVar60 + fVar59);
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              local_8980 = stbi__convert_format16(local_8980,4,req_comp,sVar19,sVar17);
            }
            else {
              local_8980 = (stbi__uint16 *)
                           stbi__convert_format((uchar *)local_8980,4,req_comp,sVar19,sVar17);
            }
            if (local_8980 == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar17;
          *x = sVar19;
          return local_8980;
        }
        goto LAB_001423b8;
      }
    }
  }
  else {
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_775f1);
    iVar21 = (int)psVar57;
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar16 = 0x54;
      while( true ) {
        iVar21 = (int)psVar57;
        bVar58 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar58) break;
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar58 = iVar16 != 0, iVar16 = iVar16 + -1, bVar58) {
          stbi__get8(s);
        }
        uVar18 = stbi__get16be(s);
        uVar23 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          lVar36 = *in_FS_OFFSET;
          pcVar35 = "bad file";
          goto LAB_0014098d;
        }
        iVar16 = stbi__mad3sizes_valid(uVar18,uVar23,4,0);
        if (iVar16 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,4,0);
          if (psVar29 != (stbi__jpeg *)0x0) {
            memset(psVar29,0xff,(ulong)(uVar18 * 4 * uVar23));
            psVar57 = pal[0] + 2;
            lVar36 = 0;
            uVar25 = uVar23;
            uVar49 = 0;
            while( true ) {
              if (lVar36 == 10) {
                *(char **)(*in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_00142c8e;
              }
              sVar9 = stbi__get8(s);
              bVar15 = stbi__get8(s);
              (*(stbi_uc (*) [4])(psVar57 + -2))[0] = bVar15;
              bVar11 = stbi__get8(s);
              psVar57[-1] = bVar11;
              bVar11 = stbi__get8(s);
              *psVar57 = bVar11;
              iVar16 = stbi__at_eof(s);
              uVar25 = uVar49;
              if (iVar16 != 0) break;
              if (bVar15 != 8) {
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad format";
                goto LAB_00142546;
              }
              uVar49 = uVar49 | bVar11;
              psVar57 = psVar57 + 3;
              lVar36 = lVar36 + 1;
              if (sVar9 == '\0') goto code_r0x001412ba;
            }
            lVar36 = *in_FS_OFFSET;
            pcVar35 = "bad file";
LAB_00142546:
            *(char **)(lVar36 + -0x20) = pcVar35;
LAB_00142c8e:
            free(psVar29);
            psVar29 = (stbi__jpeg *)0x0;
            goto LAB_00142ca8;
          }
          goto LAB_001423b8;
        }
        goto LAB_00143318;
      }
    }
    psVar29 = (stbi__jpeg *)calloc(1,0x4888);
    if (psVar29 == (stbi__jpeg *)0x0) {
      *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    }
    else {
      psVar29->s = s;
      psVar29->idct_block_kernel = stbi__idct_simd;
      psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar16 = stbi__decode_jpeg_header(psVar29,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar29);
      if (iVar16 != 0) {
        psVar29 = (stbi__jpeg *)calloc(1,0x4888);
        if (psVar29 != (stbi__jpeg *)0x0) {
          psVar29->s = s;
          psVar29->idct_block_kernel = stbi__idct_simd;
          psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
          psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
          s->img_n = 0;
          if ((uint)req_comp < 5) {
            for (lVar36 = 0x46d8; lVar36 != 0x4858; lVar36 = lVar36 + 0x60) {
              psVar57 = psVar29->huff_dc[0].fast + lVar36 + -8;
              psVar57[0] = '\0';
              psVar57[1] = '\0';
              psVar57[2] = '\0';
              psVar57[3] = '\0';
              psVar57[4] = '\0';
              psVar57[5] = '\0';
              psVar57[6] = '\0';
              psVar57[7] = '\0';
              psVar57[8] = '\0';
              psVar57[9] = '\0';
              psVar57[10] = '\0';
              psVar57[0xb] = '\0';
              psVar57[0xc] = '\0';
              psVar57[0xd] = '\0';
              psVar57[0xe] = '\0';
              psVar57[0xf] = '\0';
            }
            psVar29->restart_interval = 0;
            iVar16 = stbi__decode_jpeg_header(psVar29,0);
            if (iVar16 != 0) {
              paVar1 = psVar29->img_comp;
              bVar15 = stbi__get_marker(psVar29);
              while (bVar15 == 0xda) {
                iVar16 = stbi__get16be(psVar29->s);
                bVar15 = stbi__get8(psVar29->s);
                uVar18 = (uint)bVar15;
                psVar29->scan_n = (uint)bVar15;
                if (((byte)(bVar15 - 5) < 0xfc) ||
                   (psVar27 = psVar29->s, psVar27->img_n < (int)(uint)bVar15)) {
                  pcVar35 = "bad SOS component count";
                  goto LAB_00143385;
                }
                if (iVar16 != (uint)bVar15 * 2 + 6) {
                  pcVar35 = "bad SOS len";
                  goto LAB_00143385;
                }
                lVar36 = 0;
                while( true ) {
                  bVar15 = stbi__get8(psVar27);
                  if ((int)uVar18 <= lVar36) break;
                  bVar11 = stbi__get8(psVar29->s);
                  psVar27 = psVar29->s;
                  uVar18 = psVar27->img_n;
                  uVar40 = 0;
                  if (0 < (int)uVar18) {
                    uVar40 = (ulong)uVar18;
                  }
                  paVar46 = paVar1;
                  for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
                    if (paVar46->id == (uint)bVar15) {
                      uVar40 = uVar53 & 0xffffffff;
                      break;
                    }
                    paVar46 = paVar46 + 1;
                  }
                  if ((uint)uVar40 == uVar18) goto LAB_001433a3;
                  psVar29->img_comp[uVar40].hd = (uint)(bVar11 >> 4);
                  if (0x3f < bVar11) {
                    pcVar35 = "bad DC huff";
                    goto LAB_00143385;
                  }
                  paVar1[uVar40].ha = bVar11 & 0xf;
                  if (3 < (bVar11 & 0xf)) {
                    pcVar35 = "bad AC huff";
                    goto LAB_00143385;
                  }
                  psVar29->order[lVar36] = (uint)uVar40;
                  lVar36 = lVar36 + 1;
                  uVar18 = psVar29->scan_n;
                }
                psVar29->spec_start = (uint)bVar15;
                bVar15 = stbi__get8(psVar29->s);
                psVar29->spec_end = (uint)bVar15;
                bVar15 = stbi__get8(psVar29->s);
                psVar29->succ_high = (uint)(bVar15 >> 4);
                psVar29->succ_low = bVar15 & 0xf;
                iVar16 = psVar29->spec_start;
                if (psVar29->progressive == 0) {
                  if ((iVar16 != 0) || ((0xf < bVar15 || ((bVar15 & 0xf) != 0)))) {
LAB_0014337e:
                    pcVar35 = "bad SOS";
                    goto LAB_00143385;
                  }
                  psVar29->spec_end = 0x3f;
                }
                else if ((((0x3f < iVar16) || (0x3f < psVar29->spec_end)) ||
                         (psVar29->spec_end < iVar16)) ||
                        ((0xdf < bVar15 || (0xd < (bVar15 & 0xf))))) goto LAB_0014337e;
                stbi__jpeg_reset(psVar29);
                if (psVar29->progressive != 0) {
                  if (psVar29->scan_n == 1) {
                    iVar16 = psVar29->order[0];
                    iVar39 = psVar29->img_comp[iVar16].x + 7 >> 3;
                    iVar21 = psVar29->img_comp[iVar16].y + 7 >> 3;
                    iVar44 = 0;
                    if (iVar39 < 1) {
                      iVar39 = 0;
                    }
                    if (iVar21 < 1) {
                      iVar21 = iVar44;
                    }
                    for (; iVar44 != iVar21; iVar44 = iVar44 + 1) {
                      for (iVar48 = 0; iVar48 != iVar39; iVar48 = iVar48 + 1) {
                        psVar56 = paVar1[iVar16].coeff +
                                  (paVar1[iVar16].coeff_w * iVar44 + iVar48) * 0x40;
                        uVar40 = (ulong)psVar29->spec_start;
                        if (uVar40 == 0) {
                          iVar38 = stbi__jpeg_decode_block_prog_dc
                                             (psVar29,psVar56,
                                              (stbi__huffman *)
                                              psVar29->huff_dc[paVar1[iVar16].hd].fast,iVar16);
                          if (iVar38 == 0) goto LAB_001433a3;
                        }
                        else {
                          iVar38 = paVar1[iVar16].ha;
                          psVar57 = psVar29->huff_ac[iVar38].fast;
                          iVar52 = psVar29->eob_run;
                          bVar15 = (byte)psVar29->succ_low;
                          if (psVar29->succ_high == 0) {
                            if (iVar52 == 0) {
                              do {
                                if (psVar29->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar29);
                                }
                                sVar37 = psVar29->fast_ac[iVar38][psVar29->code_buffer >> 0x17];
                                uVar18 = (uint)sVar37;
                                iVar52 = (int)uVar40;
                                if (sVar37 == 0) {
                                  uVar18 = stbi__jpeg_huff_decode(psVar29,(stbi__huffman *)psVar57);
                                  if ((int)uVar18 < 0) goto LAB_00142cdd;
                                  uVar23 = uVar18 >> 4;
                                  if ((uVar18 & 0xf) == 0) {
                                    if (uVar18 < 0xf0) {
                                      iVar52 = 1 << ((byte)uVar23 & 0x1f);
                                      psVar29->eob_run = iVar52;
                                      if (0xf < uVar18) {
                                        iVar52 = stbi__jpeg_get_bits(psVar29,uVar23);
                                        iVar52 = iVar52 + psVar29->eob_run;
                                      }
                                      goto LAB_00141b8a;
                                    }
                                    uVar40 = (ulong)(iVar52 + 0x10);
                                  }
                                  else {
                                    lVar36 = (ulong)uVar23 + (long)iVar52;
                                    uVar40 = (ulong)((int)lVar36 + 1);
                                    bVar11 = ""[lVar36];
                                    iVar52 = stbi__extend_receive(psVar29,uVar18 & 0xf);
                                    psVar56[bVar11] = (short)(iVar52 << (bVar15 & 0x1f));
                                  }
                                }
                                else {
                                  uVar23 = uVar18 & 0xf;
                                  if (psVar29->code_bits < (int)uVar23) goto LAB_00142cdd;
                                  lVar36 = (ulong)(uVar18 >> 4 & 0xf) + (long)iVar52;
                                  psVar29->code_buffer = psVar29->code_buffer << (sbyte)uVar23;
                                  psVar29->code_bits = psVar29->code_bits - uVar23;
                                  uVar40 = (ulong)((int)lVar36 + 1);
                                  psVar56[""[lVar36]] = (short)((uVar18 >> 8) << (bVar15 & 0x1f));
                                }
                              } while ((int)uVar40 <= psVar29->spec_end);
                            }
                            else {
LAB_00141b8a:
                              psVar29->eob_run = iVar52 + -1;
                            }
                          }
                          else if (iVar52 == 0) {
                            iVar38 = 0x10000 << (bVar15 & 0x1f);
                            do {
                              uVar18 = stbi__jpeg_huff_decode(psVar29,(stbi__huffman *)psVar57);
                              if ((int)uVar18 < 0) goto LAB_00142cdd;
                              uVar23 = uVar18 >> 4;
                              if ((uVar18 & 0xf) == 1) {
                                iVar52 = stbi__jpeg_get_bit(psVar29);
                                iVar24 = 1;
                                if (iVar52 == 0) {
                                  iVar24 = 0xffff;
                                }
                                sVar37 = (short)(iVar24 << (bVar15 & 0x1f));
                              }
                              else {
                                if ((uVar18 & 0xf) != 0) goto LAB_00142cdd;
                                if (uVar18 < 0xf0) {
                                  psVar29->eob_run = ~(-1 << ((byte)uVar23 & 0x1f));
                                  if (0xf < uVar18) {
                                    iVar52 = stbi__jpeg_get_bits(psVar29,uVar23);
                                    psVar29->eob_run = psVar29->eob_run + iVar52;
                                  }
                                  uVar23 = 0x40;
                                }
                                else {
                                  uVar23 = 0xf;
                                }
                                sVar37 = 0;
                              }
                              uVar53 = (long)(int)uVar40;
                              do {
                                while( true ) {
                                  uVar40 = uVar53;
                                  iVar52 = psVar29->spec_end;
                                  if ((long)iVar52 < (long)uVar40) goto LAB_00141cb9;
                                  bVar11 = ""[uVar40];
                                  if (psVar56[bVar11] == 0) break;
                                  iVar52 = stbi__jpeg_get_bit(psVar29);
                                  if ((iVar52 != 0) &&
                                     (sVar4 = psVar56[bVar11], (iVar38 >> 0x10 & (int)sVar4) == 0))
                                  {
                                    sVar7 = (short)((uint)iVar38 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar7 = -sVar7;
                                    }
                                    psVar56[bVar11] = sVar4 + sVar7;
                                  }
                                  uVar53 = uVar40 + 1;
                                }
                                bVar58 = uVar23 != 0;
                                uVar23 = uVar23 - 1;
                                uVar53 = uVar40 + 1;
                              } while (bVar58);
                              psVar56[bVar11] = sVar37;
                              uVar40 = uVar40 + 1;
LAB_00141cb9:
                            } while ((int)uVar40 <= iVar52);
                          }
                          else {
                            psVar29->eob_run = iVar52 + -1;
                            uVar18 = (0x10000 << (bVar15 & 0x1f)) >> 0x10;
                            for (; (long)uVar40 <= (long)psVar29->spec_end; uVar40 = uVar40 + 1) {
                              bVar15 = ""[uVar40];
                              if (((psVar56[bVar15] != 0) &&
                                  (iVar38 = stbi__jpeg_get_bit(psVar29), iVar38 != 0)) &&
                                 (sVar37 = psVar56[bVar15], (uVar18 & (int)sVar37) == 0)) {
                                uVar23 = -uVar18;
                                if (0 < sVar37) {
                                  uVar23 = uVar18;
                                }
                                psVar56[bVar15] = (short)uVar23 + sVar37;
                              }
                            }
                          }
                        }
                        iVar38 = psVar29->todo;
                        psVar29->todo = iVar38 + -1;
                        if (iVar38 < 2) {
                          if (psVar29->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar29);
                          }
                          bVar15 = psVar29->marker;
                          if ((bVar15 & 0xf8) != 0xd0) goto LAB_0014229c;
                          stbi__jpeg_reset(psVar29);
                        }
                      }
                    }
                  }
                  else {
                    for (iVar16 = 0; iVar16 < psVar29->img_mcu_y; iVar16 = iVar16 + 1) {
                      for (iVar21 = 0; iVar21 < psVar29->img_mcu_x; iVar21 = iVar21 + 1) {
                        for (lVar36 = 0; lVar36 < psVar29->scan_n; lVar36 = lVar36 + 1) {
                          iVar39 = psVar29->order[lVar36];
                          for (iVar44 = 0; iVar44 < paVar1[iVar39].v; iVar44 = iVar44 + 1) {
                            iVar48 = 0;
                            while (iVar48 < paVar1[iVar39].h) {
                              iVar38 = stbi__jpeg_decode_block_prog_dc
                                                 (psVar29,paVar1[iVar39].coeff +
                                                          (paVar1[iVar39].h * iVar21 + iVar48 +
                                                          (paVar1[iVar39].v * iVar16 + iVar44) *
                                                          paVar1[iVar39].coeff_w) * 0x40,
                                                  (stbi__huffman *)
                                                  psVar29->huff_dc[paVar1[iVar39].hd].fast,iVar39);
                              iVar48 = iVar48 + 1;
                              if (iVar38 == 0) goto LAB_001433a3;
                            }
                          }
                        }
                        iVar39 = psVar29->todo;
                        psVar29->todo = iVar39 + -1;
                        if (iVar39 < 2) {
                          if (psVar29->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar29);
                          }
                          bVar15 = psVar29->marker;
                          if ((bVar15 & 0xf8) != 0xd0) goto LAB_0014229c;
                          stbi__jpeg_reset(psVar29);
                        }
                      }
                    }
                  }
                  goto LAB_00142295;
                }
                if (psVar29->scan_n == 1) {
                  iVar16 = psVar29->order[0];
                  uVar18 = psVar29->img_comp[iVar16].x + 7 >> 3;
                  iVar21 = psVar29->img_comp[iVar16].y + 7 >> 3;
                  if ((int)uVar18 < 1) {
                    uVar18 = 0;
                  }
                  iVar39 = 0;
                  if (iVar21 < 1) {
                    iVar21 = 0;
                  }
                  for (iVar44 = 0; iVar44 != iVar21; iVar44 = iVar44 + 1) {
                    for (lVar36 = 0; (ulong)uVar18 * 8 != lVar36; lVar36 = lVar36 + 8) {
                      iVar48 = stbi__jpeg_decode_block
                                         (psVar29,(short *)pal,
                                          (stbi__huffman *)psVar29->huff_dc[paVar1[iVar16].hd].fast,
                                          (stbi__huffman *)psVar29->huff_ac[paVar1[iVar16].ha].fast,
                                          psVar29->fast_ac[paVar1[iVar16].ha],iVar16,
                                          psVar29->dequant[paVar1[iVar16].tq]);
                      if (iVar48 == 0) {
                        bVar58 = false;
                        goto LAB_0014228d;
                      }
                      (*psVar29->idct_block_kernel)
                                (paVar1[iVar16].data + lVar36 + iVar39 * paVar1[iVar16].w2,
                                 paVar1[iVar16].w2,(short *)pal);
                      iVar48 = psVar29->todo;
                      psVar29->todo = iVar48 + -1;
                      if (iVar48 < 2) {
                        if (psVar29->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar29);
                        }
                        if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_0014228a;
                        stbi__jpeg_reset(psVar29);
                      }
                    }
                    iVar39 = iVar39 + 8;
                  }
LAB_0014228a:
                  bVar58 = true;
                }
                else {
                  for (iVar16 = 0; iVar16 < psVar29->img_mcu_y; iVar16 = iVar16 + 1) {
                    for (iVar21 = 0; iVar21 < psVar29->img_mcu_x; iVar21 = iVar21 + 1) {
                      for (lVar36 = 0; lVar36 < psVar29->scan_n; lVar36 = lVar36 + 1) {
                        iVar39 = psVar29->order[lVar36];
                        for (iVar44 = 0; iVar44 < paVar1[iVar39].v; iVar44 = iVar44 + 1) {
                          for (iVar48 = 0; iVar38 = paVar1[iVar39].h, iVar48 < iVar38;
                              iVar48 = iVar48 + 1) {
                            iVar52 = paVar1[iVar39].v;
                            iVar24 = stbi__jpeg_decode_block
                                               (psVar29,(short *)pal,
                                                (stbi__huffman *)
                                                psVar29->huff_dc[paVar1[iVar39].hd].fast,
                                                (stbi__huffman *)
                                                psVar29->huff_ac[paVar1[iVar39].ha].fast,
                                                psVar29->fast_ac[paVar1[iVar39].ha],iVar39,
                                                psVar29->dequant[paVar1[iVar39].tq]);
                            if (iVar24 == 0) {
                              bVar58 = false;
                              goto LAB_0014228d;
                            }
                            (*psVar29->idct_block_kernel)
                                      (paVar1[iVar39].data +
                                       (long)((iVar38 * iVar21 + iVar48) * 8) +
                                       (long)((iVar52 * iVar16 + iVar44) * paVar1[iVar39].w2 * 8),
                                       paVar1[iVar39].w2,(short *)pal);
                          }
                        }
                      }
                      iVar39 = psVar29->todo;
                      psVar29->todo = iVar39 + -1;
                      if (iVar39 < 2) {
                        if (psVar29->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar29);
                        }
                        if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_00142317;
                        stbi__jpeg_reset(psVar29);
                      }
                    }
                  }
LAB_00142317:
                  bVar58 = true;
                }
LAB_0014228d:
                if (!bVar58) goto LAB_001433a3;
LAB_00142295:
                bVar15 = psVar29->marker;
LAB_0014229c:
                if (bVar15 == 0xff) {
                  while (iVar16 = stbi__at_eof(psVar29->s), iVar16 == 0) {
                    sVar9 = stbi__get8(psVar29->s);
                    while (sVar9 == 0xff) {
                      iVar16 = stbi__at_eof(psVar29->s);
                      if (iVar16 != 0) goto LAB_001422e4;
                      sVar9 = stbi__get8(psVar29->s);
                      if ((byte)(sVar9 - 1) < 0xfe) goto LAB_001422e6;
                    }
                  }
LAB_001422e4:
                  sVar9 = 0xff;
LAB_001422e6:
                  psVar29->marker = sVar9;
                }
                bVar15 = stbi__get_marker(psVar29);
                if ((bVar15 & 0xf8) == 0xd0) {
LAB_00141843:
                  bVar15 = stbi__get_marker(psVar29);
                }
              }
              uVar18 = (uint)bVar15;
              if (uVar18 == 0xdc) {
                iVar16 = stbi__get16be(psVar29->s);
                sVar17 = stbi__get16be(psVar29->s);
                if (iVar16 == 4) {
                  if (sVar17 == psVar29->s->img_y) goto LAB_00141843;
                  pcVar35 = "bad DNL height";
                }
                else {
                  pcVar35 = "bad DNL len";
                }
                goto LAB_00143385;
              }
              if (uVar18 == 0xd9) {
                if (psVar29->progressive != 0) {
                  for (lVar36 = 0; lVar36 < psVar29->s->img_n; lVar36 = lVar36 + 1) {
                    uVar18 = psVar29->img_comp[lVar36].x + 7 >> 3;
                    iVar16 = psVar29->img_comp[lVar36].y + 7 >> 3;
                    uVar53 = 0;
                    uVar40 = (ulong)uVar18;
                    if ((int)uVar18 < 1) {
                      uVar40 = uVar53;
                    }
                    if (iVar16 < 1) {
                      iVar16 = 0;
                    }
                    while (iVar21 = (int)uVar53, iVar21 != iVar16) {
                      for (uVar53 = 0; uVar53 != uVar40; uVar53 = uVar53 + 1) {
                        psVar56 = paVar1[lVar36].coeff;
                        iVar44 = paVar1[lVar36].coeff_w * iVar21;
                        iVar39 = paVar1[lVar36].tq;
                        iVar48 = iVar44 + (int)uVar53;
                        for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
                          psVar56[iVar48 * 0x40 + lVar31] =
                               psVar56[iVar48 * 0x40 + lVar31] * psVar29->dequant[iVar39][lVar31];
                        }
                        (*psVar29->idct_block_kernel)
                                  (paVar1[lVar36].data +
                                   uVar53 * 8 + (long)(iVar21 * 8 * paVar1[lVar36].w2),
                                   paVar1[lVar36].w2,psVar56 + (iVar44 + (int)uVar53) * 0x40);
                      }
                      uVar53 = (ulong)(iVar21 + 1);
                    }
                  }
                }
              }
              else {
                iVar16 = stbi__process_marker(psVar29,uVar18);
                if (iVar16 != 0) goto LAB_00141843;
              }
              psVar43 = psVar29->s;
              uVar18 = psVar43->img_n;
              uVar23 = (2 < (int)uVar18) + 1 + (uint)(2 < (int)uVar18);
              if (req_comp != 0) {
                uVar23 = req_comp;
              }
              if (uVar18 == 3) {
                bVar58 = true;
                if (psVar29->rgb != 3) {
                  if (psVar29->app14_color_transform == 0) {
                    bVar58 = psVar29->jfif == 0;
                  }
                  else {
                    bVar58 = false;
                  }
                }
              }
              else {
                bVar58 = false;
              }
              uVar25 = 1;
              if (bVar58) {
                uVar25 = uVar18;
              }
              if (2 < (int)uVar23) {
                uVar25 = uVar18;
              }
              if (uVar18 != 3) {
                uVar25 = uVar18;
              }
              if (0 < (int)uVar25) {
                _value = (stbi_uc *)0x0;
                sVar17 = psVar43->img_x;
                for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                  pvVar26 = malloc((ulong)(sVar17 + 3));
                  *(void **)((long)&psVar29->img_comp[0].linebuf + lVar36 * 2) = pvVar26;
                  if (pvVar26 == (void *)0x0) goto LAB_00143eeb;
                  uVar40 = (long)psVar29->img_h_max /
                           (long)*(int *)((long)&psVar29->img_comp[0].h + lVar36 * 2);
                  iVar16 = (int)uVar40;
                  *(int *)(pal[6] + lVar36) = iVar16;
                  iVar21 = psVar29->img_v_max / *(int *)((long)&psVar29->img_comp[0].v + lVar36 * 2)
                  ;
                  *(int *)(pal[7] + lVar36) = iVar21;
                  *(int *)(pal[9] + lVar36) = iVar21 >> 1;
                  *(int *)(pal[8] + lVar36) =
                       (int)((ulong)(iVar16 + (sVar17 - 1)) / (uVar40 & 0xffffffff));
                  psVar57 = pal[10] + lVar36;
                  psVar57[0] = '\0';
                  psVar57[1] = '\0';
                  psVar57[2] = '\0';
                  psVar57[3] = '\0';
                  uVar34 = *(undefined8 *)((long)&psVar29->img_comp[0].data + lVar36 * 2);
                  *(undefined8 *)(pal[4] + lVar36) = uVar34;
                  *(undefined8 *)(pal[2] + lVar36) = uVar34;
                  if (iVar16 == 2) {
                    pcVar33 = stbi__resample_row_h_2;
                    if (iVar21 != 1) {
                      if (iVar21 != 2) goto LAB_00143886;
                      pcVar33 = psVar29->resample_row_hv_2_kernel;
                    }
                  }
                  else if (iVar16 == 1) {
                    pcVar33 = stbi__resample_row_generic;
                    if (iVar21 == 2) {
                      pcVar33 = stbi__resample_row_v_2;
                    }
                    if (iVar21 == 1) {
                      pcVar33 = resample_row_1;
                    }
                  }
                  else {
LAB_00143886:
                    pcVar33 = stbi__resample_row_generic;
                  }
                  *(code **)(pal[0] + lVar36) = pcVar33;
                }
                sVar19 = psVar43->img_y;
                psVar27 = (stbi__context *)stbi__malloc_mad3(uVar23,sVar17,sVar19,1);
                if (psVar27 == (stbi__context *)0x0) {
LAB_00143eeb:
                  stbi__cleanup_jpeg(psVar29);
                  *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
                  psVar27 = (stbi__context *)0x0;
                }
                else {
                  iVar16 = 0;
                  for (uVar18 = 0; uVar18 < sVar19; uVar18 = uVar18 + 1) {
                    sVar17 = psVar43->img_x;
                    psVar57 = value;
                    for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                      iVar21 = *(int *)(pal[9] + lVar36);
                      iVar39 = *(int *)(pal[7] + lVar36);
                      iVar44 = iVar39 >> 1;
                      psVar55 = pal[4] + lVar36;
                      if (iVar21 < iVar44) {
                        psVar55 = pal[2] + lVar36;
                      }
                      psVar30 = pal[4] + lVar36;
                      if (iVar44 <= iVar21) {
                        psVar30 = pal[2] + lVar36;
                      }
                      uVar34 = (**(code **)(pal[0] + lVar36))
                                         (*(undefined8 *)
                                           ((long)&psVar29->img_comp[0].linebuf + lVar36 * 2),
                                          *(undefined8 *)psVar55,*(undefined8 *)psVar30,
                                          *(undefined4 *)(pal[8] + lVar36));
                      *(undefined8 *)psVar57 = uVar34;
                      *(int *)(pal[9] + lVar36) = iVar21 + 1;
                      if (iVar39 <= iVar21 + 1) {
                        psVar55 = pal[9] + lVar36;
                        psVar55[0] = '\0';
                        psVar55[1] = '\0';
                        psVar55[2] = '\0';
                        psVar55[3] = '\0';
                        lVar31 = *(long *)(pal[4] + lVar36);
                        *(long *)(pal[2] + lVar36) = lVar31;
                        iVar21 = *(int *)(pal[10] + lVar36) + 1;
                        *(int *)(pal[10] + lVar36) = iVar21;
                        if (iVar21 < *(int *)((long)&psVar29->img_comp[0].y + lVar36 * 2)) {
                          *(long *)(pal[4] + lVar36) =
                               lVar31 + *(int *)((long)&psVar29->img_comp[0].w2 + lVar36 * 2);
                        }
                      }
                      psVar57 = psVar57 + 8;
                    }
                    if ((int)uVar23 < 3) {
                      psVar43 = psVar29->s;
                      if (bVar58) {
                        uVar40 = (ulong)(sVar17 * iVar16);
                        if (uVar23 == 1) {
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            pbVar47[(long)(psVar27->buffer_start + uVar40 + -0x38)] =
                                 (byte)((uint)*pbVar47 * 0x1d +
                                        (uint)*pbVar47 * 0x96 + (uint)_value[(long)pbVar47] * 0x4d
                                       >> 8);
                          }
                        }
                        else {
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            psVar27->buffer_start[(long)pbVar47 * 2 + uVar40 + -0x38] =
                                 (stbi_uc)((uint)*pbVar47 * 0x1d +
                                           (uint)*pbVar47 * 0x96 +
                                           (uint)_value[(long)pbVar47] * 0x4d >> 8);
                            psVar27->buffer_start[(long)pbVar47 * 2 + uVar40 + 0xffffffffffffffc9] =
                                 0xff;
                          }
                        }
                      }
                      else if (psVar43->img_n == 4) {
                        if (psVar29->app14_color_transform == 2) {
                          psVar57 = psVar27->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            iVar21 = (_value[(long)pbVar47] ^ 0xff) * (uint)*pbVar47;
                            psVar57[-1] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar23;
                          }
                        }
                        else {
                          if (psVar29->app14_color_transform != 0) goto LAB_00143d25;
                          psVar57 = psVar27->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar21 = (uint)_value[(long)pbVar47] * (uint)bVar15;
                            iVar39 = (uint)*pbVar47 * (uint)bVar15;
                            psVar57[-1] = (char)((((uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) +
                                                  (uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) * 0x1d
                                                 + (iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar21 + (iVar21 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar23;
                          }
                        }
                      }
                      else {
LAB_00143d25:
                        uVar40 = (ulong)(sVar17 * iVar16);
                        if (uVar23 == 1) {
                          for (uVar53 = 0; uVar53 < psVar43->img_x; uVar53 = uVar53 + 1) {
                            psVar27->buffer_start[uVar53 + uVar40 + -0x38] = _value[uVar53];
                          }
                        }
                        else {
                          for (uVar53 = 0; uVar53 < psVar43->img_x; uVar53 = uVar53 + 1) {
                            psVar27->buffer_start[uVar53 * 2 + uVar40 + -0x38] = _value[uVar53];
                            psVar27->buffer_start[uVar53 * 2 + uVar40 + 0xffffffffffffffc9] = 0xff;
                          }
                        }
                      }
                    }
                    else {
                      psVar43 = psVar29->s;
                      if (psVar43->img_n == 3) {
                        if (bVar58) {
                          psVar57 = psVar27->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                          for (puVar45 = (undefined1 *)0x0;
                              puVar45 < (undefined1 *)(ulong)psVar43->img_x; puVar45 = puVar45 + 1)
                          {
                            psVar57[-3] = _value[(long)puVar45];
                            psVar57[-2] = *puVar45;
                            psVar57[-1] = *puVar45;
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar23;
                          }
                        }
                        else {
LAB_00143d5b:
                          (*psVar29->YCbCr_to_RGB_kernel)
                                    (psVar27->buffer_start +
                                     (ulong)(uVar18 * uVar23 * sVar17) + -0x38,_value,(stbi_uc *)0x0
                                     ,(stbi_uc *)0x0,psVar43->img_x,uVar23);
                        }
                      }
                      else if (psVar43->img_n == 4) {
                        if (psVar29->app14_color_transform == 2) {
                          (*psVar29->YCbCr_to_RGB_kernel)
                                    (psVar27->buffer_start +
                                     (ulong)(uVar18 * uVar23 * sVar17) + -0x38,_value,(stbi_uc *)0x0
                                     ,(stbi_uc *)0x0,psVar43->img_x,uVar23);
                          psVar43 = psVar29->s;
                          psVar57 = psVar27->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffca;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar21 = (psVar57[-2] ^ 0xff) * (uint)bVar15;
                            psVar57[-2] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (psVar57[-1] ^ 0xff) * (uint)bVar15;
                            psVar57[-1] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (*psVar57 ^ 0xff) * (uint)bVar15;
                            *psVar57 = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar57 = psVar57 + uVar23;
                          }
                        }
                        else {
                          if (psVar29->app14_color_transform != 0) goto LAB_00143d5b;
                          psVar57 = psVar27->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar21 = (uint)_value[(long)pbVar47] * (uint)bVar15;
                            psVar57[-3] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (uint)*pbVar47 * (uint)bVar15;
                            psVar57[-2] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar57[-1] = (char)(((uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) +
                                                 (uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar23;
                          }
                        }
                      }
                      else {
                        psVar57 = psVar27->buffer_start +
                                  (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                        for (uVar40 = 0; uVar40 < psVar43->img_x; uVar40 = uVar40 + 1) {
                          sVar9 = _value[uVar40];
                          psVar57[-1] = sVar9;
                          psVar57[-2] = sVar9;
                          psVar57[-3] = sVar9;
                          *psVar57 = 0xff;
                          psVar57 = psVar57 + uVar23;
                        }
                      }
                    }
                    psVar43 = psVar29->s;
                    sVar19 = psVar43->img_y;
                    iVar16 = iVar16 + uVar23;
                  }
                  stbi__cleanup_jpeg(psVar29);
                  psVar43 = psVar29->s;
                  *x = psVar43->img_x;
                  *y = psVar43->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar43->img_n) * 2 + 1;
                  }
                }
                goto LAB_00140d94;
              }
            }
            goto LAB_001433a3;
          }
          *(char **)(*in_FS_OFFSET + -0x20) = "bad req_comp";
          goto LAB_001433a8;
        }
        goto LAB_001423b8;
      }
    }
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    if ((sVar9 != 'P') || ((byte)(sVar10 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 != 0) {
        psVar29 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        if (psVar29 == (stbi__jpeg *)0x0) {
          return (void *)0x0;
        }
        iVar16 = *x;
        iVar21 = *y;
        psVar27 = (stbi__context *)stbi__malloc_mad3(iVar16,iVar21,req_comp,0);
        if (psVar27 != (stbi__context *)0x0) {
          uVar23 = (req_comp + (req_comp & 1U)) - 1;
          uVar18 = iVar21 * iVar16;
          uVar40 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar40 = 0;
          }
          lVar36 = (long)req_comp;
          uVar53 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar53 = 0;
          }
          psVar43 = psVar27;
          psVar41 = psVar29;
          for (uVar54 = 0; uVar54 != uVar53; uVar54 = uVar54 + 1) {
            for (uVar42 = 0; uVar40 != uVar42; uVar42 = uVar42 + 1) {
              fVar59 = powf(*(float *)(psVar41->huff_dc[0].fast + uVar42 * 4 + -8) *
                            stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar60 = fVar59 * 255.0 + 0.5;
              fVar59 = 0.0;
              if (0.0 <= fVar60) {
                fVar59 = fVar60;
              }
              fVar60 = 255.0;
              if (fVar59 <= 255.0) {
                fVar60 = fVar59;
              }
              psVar43->buffer_start[uVar42 + -0x38] = (stbi_uc)(int)fVar60;
            }
            if ((int)uVar40 < req_comp) {
              lVar31 = uVar54 * lVar36 + uVar40;
              fVar60 = *(float *)(psVar29->huff_dc[0].fast + lVar31 * 4 + -8) * 255.0 + 0.5;
              fVar59 = 0.0;
              if (0.0 <= fVar60) {
                fVar59 = fVar60;
              }
              fVar60 = 255.0;
              if (fVar59 <= 255.0) {
                fVar60 = fVar59;
              }
              psVar27->buffer_start[lVar31 + -0x38] = (stbi_uc)(int)fVar60;
            }
            psVar43 = (stbi__context *)(psVar43->buffer_start + lVar36 + -0x38);
            psVar41 = (stbi__jpeg *)(psVar41->huff_dc[0].fast + lVar36 * 4 + -8);
          }
LAB_00140d94:
          free(psVar29);
          return psVar27;
        }
LAB_001423b3:
        free(psVar29);
        goto LAB_001423b8;
      }
      stbi__get8(s);
      bVar15 = stbi__get8(s);
      if (bVar15 < 2) {
        bVar11 = stbi__get8(s);
        if (bVar15 == 1) {
          if ((bVar11 & 0xf7) == 1) {
            iVar16 = 4;
            stbi__skip(s,4);
            bVar11 = stbi__get8(s);
            if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
            goto LAB_00142445;
          }
          goto LAB_00142333;
        }
        if ((bVar11 & 0xf6) != 2) goto LAB_00142333;
        iVar16 = 9;
LAB_00142445:
        stbi__skip(s,iVar16);
        iVar16 = stbi__get16le(s);
        if ((iVar16 == 0) || (iVar16 = stbi__get16le(s), iVar16 == 0)) goto LAB_00142333;
        bVar11 = stbi__get8(s);
        if (bVar15 != 1) {
          if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            goto LAB_00142883;
          }
          goto LAB_00142333;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar11 - 8 & 0xf7) == 0) {
LAB_00142883:
          bVar11 = stbi__get8(s);
          sVar9 = stbi__get8(s);
          bVar12 = stbi__get8(s);
          iVar16 = stbi__get16le(s);
          uVar49 = stbi__get16le(s);
          bVar15 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar18 = stbi__get16le(s);
          uVar23 = stbi__get16le(s);
          bVar13 = stbi__get8(s);
          pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
          bVar14 = stbi__get8(s);
          _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
          if (sVar9 == '\0') {
            uVar25 = bVar12 - 8;
            if (bVar12 < 8) {
              uVar25 = (uint)bVar12;
            }
            uVar25 = (uint)(uVar25 == 3);
            bVar15 = bVar13;
          }
          else {
            uVar25 = 0;
          }
          uVar25 = stbi__tga_get_comp((uint)bVar15,uVar25,(int *)pal);
          if (uVar25 == 0) {
            lVar36 = *in_FS_OFFSET;
            pcVar35 = "bad format";
            goto LAB_0014098d;
          }
          *x = uVar18;
          *y = uVar23;
          if (comp != (int *)0x0) {
            *comp = uVar25;
          }
          iVar21 = stbi__mad3sizes_valid(uVar18,uVar23,uVar25,0);
          if (iVar21 == 0) goto LAB_00143318;
          psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,uVar25,0);
          if (psVar29 == (stbi__jpeg *)0x0) goto LAB_001423b8;
          stbi__skip(s,(uint)bVar11);
          uVar40 = (ulong)uVar25;
          if (((sVar9 == '\0') && (bVar12 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
            uVar50 = 0;
            uVar49 = uVar23;
            while (uVar49 = uVar49 - 1, uVar49 != 0xffffffff) {
              uVar51 = uVar50;
              if ((bVar14 >> 5 & 1) == 0) {
                uVar51 = uVar49;
              }
              stbi__getn(s,psVar29->huff_dc[0].fast + (long)(int)(uVar51 * uVar25 * uVar18) + -8,
                         uVar25 * uVar18);
              uVar50 = uVar50 + 1;
            }
          }
          else {
            if (sVar9 == '\0') {
              local_8948 = (stbi__jpeg *)0x0;
            }
            else {
              if (uVar49 == 0) {
LAB_0014415a:
                free(psVar29);
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad palette";
                goto LAB_0014098d;
              }
              stbi__skip(s,iVar16);
              local_8948 = (stbi__jpeg *)stbi__malloc_mad2(uVar49,uVar25,0);
              if (local_8948 == (stbi__jpeg *)0x0) goto LAB_001423b3;
              psVar41 = local_8948;
              uVar50 = uVar49;
              if (pal[0] == (stbi_uc  [4])0x0) {
                iVar16 = stbi__getn(s,(stbi_uc *)local_8948,uVar25 * uVar49);
                if (iVar16 == 0) {
                  free(psVar29);
                  psVar29 = local_8948;
                  goto LAB_0014415a;
                }
              }
              else {
                while (uVar50 != 0) {
                  stbi__tga_read_rgb16(s,(stbi_uc *)psVar41);
                  psVar41 = (stbi__jpeg *)(psVar41->huff_dc[0].fast + (uVar40 - 8));
                  uVar50 = uVar50 - 1;
                }
              }
            }
            bVar58 = true;
            iVar16 = 0;
            local_8970 = 0;
            psVar41 = psVar29;
            for (uVar53 = 0; uVar53 != uVar23 * uVar18; uVar53 = uVar53 + 1) {
              if (bVar12 < 8) {
LAB_00143fc6:
                if (sVar9 == '\0') {
                  if (pal[0] == (stbi_uc  [4])0x0) {
                    for (uVar54 = 0; uVar40 != uVar54; uVar54 = uVar54 + 1) {
                      sVar10 = stbi__get8(s);
                      value[uVar54] = sVar10;
                    }
                  }
                  else {
                    stbi__tga_read_rgb16(s,value);
                  }
                }
                else {
                  if (bVar13 == 8) {
                    bVar15 = stbi__get8(s);
                    uVar50 = (uint)bVar15;
                  }
                  else {
                    uVar50 = stbi__get16le(s);
                  }
                  if (uVar49 <= uVar50) {
                    uVar50 = 0;
                  }
                  for (uVar54 = 0; uVar40 != uVar54; uVar54 = uVar54 + 1) {
                    value[uVar54] = local_8948->huff_dc[0].fast[uVar54 + uVar50 * uVar25 + -8];
                  }
                }
              }
              else {
                if (iVar16 == 0) {
                  bVar15 = stbi__get8(s);
                  iVar16 = (bVar15 & 0x7f) + 1;
                  local_8970 = (uint)(bVar15 >> 7);
                  goto LAB_00143fc6;
                }
                if (local_8970 == 0 || bVar58) {
                  local_8970 = (uint)(local_8970 != 0);
                  goto LAB_00143fc6;
                }
                local_8970 = 1;
              }
              for (uVar54 = 0; uVar40 != uVar54; uVar54 = uVar54 + 1) {
                psVar41->huff_dc[0].fast[uVar54 - 8] = value[uVar54];
              }
              iVar16 = iVar16 + -1;
              psVar41 = (stbi__jpeg *)(psVar41->huff_dc[0].fast + (uVar40 - 8));
              bVar58 = false;
            }
            if ((bVar14 >> 5 & 1) == 0) {
              iVar16 = uVar25 * uVar18;
              iVar21 = (uVar23 - 1) * iVar16;
              uVar49 = 0;
              for (uVar50 = 0; uVar50 != uVar23 + 1 >> 1; uVar50 = uVar50 + 1) {
                psVar41 = psVar29;
                for (iVar39 = iVar16; 0 < iVar39; iVar39 = iVar39 + -1) {
                  sVar9 = psVar41->huff_dc[0].fast[(ulong)uVar49 - 8];
                  psVar41->huff_dc[0].fast[(ulong)uVar49 - 8] =
                       psVar41->huff_dc[0].fast[(long)iVar21 + -8];
                  psVar41->huff_dc[0].fast[(long)iVar21 + -8] = sVar9;
                  psVar41 = (stbi__jpeg *)((long)&psVar41->s + 1);
                }
                uVar49 = uVar49 + iVar16;
                iVar21 = iVar21 - iVar16;
              }
            }
            free(local_8948);
          }
          if ((2 < uVar25) && (pal[0] == (stbi_uc  [4])0x0)) {
            iVar16 = uVar23 * uVar18;
            puVar45 = (undefined1 *)((long)&psVar29->s + 2);
            while (bVar58 = iVar16 != 0, iVar16 = iVar16 + -1, bVar58) {
              uVar3 = puVar45[-2];
              puVar45[-2] = *puVar45;
              *puVar45 = uVar3;
              puVar45 = puVar45 + uVar40;
            }
          }
          if (req_comp == 0) {
            return psVar29;
          }
          if (uVar25 == req_comp) {
            return psVar29;
          }
LAB_00142cd0:
          puVar32 = stbi__convert_format((uchar *)psVar29,uVar25,req_comp,uVar18,uVar23);
          return puVar32;
        }
      }
      else {
LAB_00142333:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "unknown image type";
      goto LAB_0014098d;
    }
    y_00 = &s->img_y;
    comp_00 = &s->img_n;
    iVar16 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
    ri->bits_per_channel = iVar16;
    if (iVar16 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar17 = *y_00;
      *y = sVar17;
      iVar16 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar16;
        sVar17 = *y_00;
      }
      sVar19 = s->img_x;
      iVar39 = ri->bits_per_channel / 8;
      iVar44 = stbi__mad4sizes_valid(iVar16,sVar19,sVar17,iVar39,iVar21);
      if (iVar44 != 0) {
        psVar28 = (stbi__uint16 *)stbi__malloc_mad4(iVar16,sVar19,sVar17,iVar39,iVar21);
        if (psVar28 != (stbi__uint16 *)0x0) {
          iVar16 = stbi__getn(s,(stbi_uc *)psVar28,sVar17 * iVar16 * sVar19 * iVar39);
          if (iVar16 != 0) {
            if (req_comp == 0) {
              return psVar28;
            }
            iVar16 = *comp_00;
            if (iVar16 != req_comp) {
              if (ri->bits_per_channel == 0x10) {
                psVar28 = stbi__convert_format16(psVar28,iVar16,req_comp,s->img_x,s->img_y);
                return psVar28;
              }
              puVar32 = stbi__convert_format((uchar *)psVar28,iVar16,req_comp,s->img_x,s->img_y);
              return puVar32;
            }
            return psVar28;
          }
          free(psVar28);
          lVar36 = *in_FS_OFFSET;
          pcVar35 = "bad PNM";
          goto LAB_0014098d;
        }
        goto LAB_001423b8;
      }
    }
  }
LAB_00143318:
  lVar36 = *in_FS_OFFSET;
  pcVar35 = "too large";
LAB_0014098d:
  *(char **)(lVar36 + -0x20) = pcVar35;
  return (void *)0x0;
code_r0x001412ba:
  uVar25 = 4 - ((uVar49 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = uVar25;
  }
  for (uVar40 = 0; uVar40 != uVar23; uVar40 = uVar40 + 1) {
    psVar57 = psVar29->huff_dc[0].fast + (long)(int)(uVar18 * 4 * (int)uVar40) + -8;
    for (lVar31 = 0; lVar36 != lVar31; lVar31 = lVar31 + 1) {
      lVar6 = lVar31 * 3;
      sVar9 = pal[0][lVar6 + 1];
      psVar55 = psVar57;
      uVar49 = uVar18;
      if (sVar9 == '\0') {
        while (bVar58 = uVar49 != 0, uVar49 = uVar49 - 1, bVar58) {
          psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar55);
          if (psVar30 == (stbi_uc *)0x0) goto LAB_00142c8e;
          psVar55 = psVar55 + 4;
        }
      }
      else if (sVar9 == '\x01') {
        for (; 0 < (int)uVar49; uVar49 = uVar49 - (uVar50 & 0xff)) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_00142c66;
          psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
          if (psVar30 == (stbi_uc *)0x0) goto LAB_00142c8e;
          uVar50 = (uint)bVar15;
          if (uVar49 < bVar15) {
            uVar50 = uVar49;
          }
          uVar51 = uVar50 & 0xff;
          while (bVar58 = uVar51 != 0, uVar51 = uVar51 - 1, bVar58) {
            stbi__copyval((uint)pal[0][lVar6 + 2],psVar55,value);
            psVar55 = psVar55 + 4;
          }
        }
      }
      else {
        if (sVar9 != '\x02') {
          lVar36 = *in_FS_OFFSET;
          pcVar35 = "bad format";
LAB_00143f29:
          *(char **)(lVar36 + -0x20) = pcVar35;
          goto LAB_00142c8e;
        }
        for (; 0 < (int)uVar49; uVar49 = uVar49 - iVar16) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_00142c66;
          uVar50 = (uint)bVar15;
          if ((char)bVar15 < '\0') {
            if (uVar50 == 0x80) {
              iVar16 = stbi__get16be(s);
            }
            else {
              iVar16 = uVar50 - 0x7f;
            }
            if ((int)uVar49 < iVar16) goto LAB_0014356d;
            psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
            iVar21 = iVar16;
            if (psVar30 == (stbi_uc *)0x0) goto LAB_00142c8e;
            while (iVar21 != 0) {
              stbi__copyval((uint)pal[0][lVar6 + 2],psVar55,value);
              psVar55 = psVar55 + 4;
              iVar21 = iVar21 + -1;
            }
          }
          else {
            iVar16 = bVar15 + 1;
            iVar21 = iVar16;
            if (uVar49 <= uVar50) {
LAB_0014356d:
              lVar36 = *in_FS_OFFSET;
              pcVar35 = "bad file";
              goto LAB_00143f29;
            }
            while (bVar58 = iVar21 != 0, iVar21 = iVar21 + -1, bVar58) {
              psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar55);
              if (psVar30 == (stbi_uc *)0x0) goto LAB_00142c8e;
              psVar55 = psVar55 + 4;
            }
          }
        }
      }
    }
  }
LAB_00142ca8:
  *x = uVar18;
  *y = uVar23;
  bVar58 = req_comp != 0;
  if (bVar58) {
    uVar25 = req_comp;
  }
  req_comp = uVar25;
  if (!bVar58 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar25 = 4;
  goto LAB_00142cd0;
LAB_00142c66:
  *(char **)(*in_FS_OFFSET + -0x20) = "bad file";
  goto LAB_00142c8e;
LAB_00142cdd:
  pcVar35 = "bad huffman code";
LAB_00143385:
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar35;
LAB_001433a3:
  stbi__cleanup_jpeg(psVar29);
LAB_001433a8:
  psVar27 = (stbi__context *)0x0;
  goto LAB_00140d94;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}